

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qalloc.cpp
# Opt level: O1

void QtPrivate::sizedFree(void *ptr,size_t allocSize)

{
  free(ptr);
  return;
}

Assistant:

void QtPrivate::sizedFree(void *ptr, size_t allocSize) noexcept
{
#if QT_CONFIG(jemalloc)
    // jemalloc is okay with free(nullptr), as required by the standard,
    // but will asssert (in debug) or invoke UB (in release) on sdallocx(nullptr, ...),
    // so don't allow Qt to do that.
    if (Q_LIKELY(ptr)) {
        ::sdallocx(ptr, allocSize, 0);
        return;
    }
#endif
    Q_UNUSED(allocSize);
    ::free(ptr);
}